

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDAGetSensDky(void *ida_mem,sunrealtype t,int k,N_Vector *dkySout)

{
  long in_RDX;
  int in_ESI;
  IDAMem in_RDI;
  IDAMem IDA_mem;
  int ier;
  int is;
  N_Vector in_stack_00000060;
  int in_stack_00000068;
  int in_stack_0000006c;
  sunrealtype in_stack_00000070;
  void *in_stack_00000078;
  int local_30;
  int local_2c;
  int local_4;
  
  local_30 = 0;
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0xd59,"IDAGetSensDky",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_sensi == 0) {
    IDAProcessError(in_RDI,-0x28,0xd62,"IDAGetSensDky",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                    ,"Illegal attempt to call before calling IDASensInit.");
    local_4 = -0x28;
  }
  else if (in_RDX == 0) {
    IDAProcessError(in_RDI,-0x1b,0xd6a,"IDAGetSensDky",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                    ,"dky = NULL illegal.");
    local_4 = -0x1b;
  }
  else if ((in_ESI < 0) || (in_RDI->ida_kk < in_ESI)) {
    IDAProcessError(in_RDI,-0x19,0xd72,"IDAGetSensDky",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                    ,"Illegal value for k.");
    local_4 = -0x19;
  }
  else {
    local_2c = 0;
    while ((local_2c < in_RDI->ida_Ns &&
           (local_30 = IDAGetSensDky1(in_stack_00000078,in_stack_00000070,in_stack_0000006c,
                                      in_stack_00000068,in_stack_00000060), local_30 == 0))) {
      local_2c = local_2c + 1;
    }
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

int IDAGetSensDky(void* ida_mem, sunrealtype t, int k, N_Vector* dkySout)
{
  int is, ier = 0;
  IDAMem IDA_mem;

  /* Check all inputs for legality */

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  if (IDA_mem->ida_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_SENS);
  }

  if (dkySout == NULL)
  {
    IDAProcessError(IDA_mem, IDA_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_DKY);
  }

  if ((k < 0) || (k > IDA_mem->ida_kk))
  {
    IDAProcessError(IDA_mem, IDA_BAD_K, __LINE__, __func__, __FILE__, MSG_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_K);
  }

  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    ier = IDAGetSensDky1(ida_mem, t, k, is, dkySout[is]);
    if (ier != IDA_SUCCESS) { break; }
  }

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (ier);
}